

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_types.hpp
# Opt level: O2

shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
 __thiscall
pstore::index::
get_index<(pstore::trailer::indices)1,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
          (index *this,database *db,bool create)

{
  __shared_ptr<pstore::index::index_base,(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar1;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  sVar2;
  typed_address<pstore::index::header_block> location;
  shared_ptr<const_pstore::trailer> footer;
  undefined1 local_50 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = (__shared_ptr<pstore::index::index_base,(__gnu_cxx::_Lock_policy)2> *)
            ((db->indices_)._M_elems + 1);
  if ((db->indices_)._M_elems[1].
      super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    database::get_footer((database *)(local_50 + 0x18));
    local_50._16_8_ =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._24_8_ + 0x30))->
         _vptr__Sp_counted_base;
    if ((element_type *)local_50._16_8_ == (element_type *)0x0) {
      if (create) {
        std::
        make_shared<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,pstore::database&>
                  ((database *)local_50);
        goto LAB_0011d591;
      }
    }
    else {
      std::
      make_shared<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,pstore::database&,pstore::typed_address<pstore::index::header_block>const&>
                ((database *)local_50,(typed_address<pstore::index::header_block> *)db);
LAB_0011d591:
      std::__shared_ptr<pstore::index::index_base,(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,(__shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                          *)local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  }
  plVar1 = *(long **)this_00;
  if (create) {
    if (plVar1 == (long *)0x0) goto LAB_0011d5f1;
  }
  else if (plVar1 == (long *)0x0) goto LAB_0011d5d6;
  if ((undefined **)*plVar1 == &PTR__hamt_map_0013d188) {
LAB_0011d5d6:
    sVar2 = std::
            static_pointer_cast<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,pstore::index::index_base>
                      ((shared_ptr<pstore::index::index_base> *)this);
    sVar2.
    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
            )sVar2.
             super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
LAB_0011d5f1:
  assert_failed("(!create && dx.get () == nullptr) || dynamic_cast<Return *> (dx.get ()) != nullptr"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/index_types.hpp"
                ,0x93);
}

Assistant:

std::shared_ptr<Return> get_index (Database & db, bool const create = true) {
            auto & dx = db.get_mutable_index (Index);

            // Have we already loaded this index?
            if (dx.get () == nullptr) {
                std::shared_ptr<trailer const> const footer = db.get_footer ();
                typed_address<index::header_block> const location = footer->a.index_records.at (
                    static_cast<typename std::underlying_type<decltype (Index)>::type> (Index));
                if (location == decltype (location)::null ()) {
                    if (create) {
                        // Create a new (empty) index.
                        dx = std::make_shared<typename std::remove_const<Return>::type> (db);
                    }
                } else {
                    // Construct the index from the location.
                    dx = std::make_shared<typename std::remove_const<Return>::type> (db, location);
                }
            }

#ifdef PSTORE_CPP_RTTI
            PSTORE_ASSERT ((!create && dx.get () == nullptr) ||
                           dynamic_cast<Return *> (dx.get ()) != nullptr);
#endif
            return std::static_pointer_cast<Return> (dx);
        }